

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::Resize(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
         *this)

{
  code *pcVar1;
  bool bVar2;
  hash_t hVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  int local_a4;
  uint bucket;
  int i_1;
  TrackAllocData local_90;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *local_68;
  EntryType *newEntries;
  code *pcStack_58;
  int i;
  undefined8 local_50;
  TrackAllocData local_48;
  int *local_20;
  int *newBuckets;
  int newSize;
  int modIndex;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *this_local;
  
  newBuckets._4_4_ = 0x4b;
  _newSize = this;
  newBuckets._0_4_ = PrimePolicy::GetSize(this->count << 1,(int *)((long)&newBuckets + 4));
  if ((int)(uint)newBuckets <= this->count) {
    Js::Throw::OutOfMemory();
  }
  pRVar4 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&int::typeinfo,0,(long)(int)(uint)newBuckets,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
             ,0x165);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_48);
  pcStack_58 = Memory::Recycler::AllocLeaf;
  local_50 = 0;
  local_20 = Memory::AllocateArray<Memory::Recycler,int,false>
                       ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (long)(int)(uint)newBuckets);
  for (newEntries._4_4_ = 0; newEntries._4_4_ < (int)(uint)newBuckets;
      newEntries._4_4_ = newEntries._4_4_ + 1) {
    local_20[newEntries._4_4_] = -1;
  }
  pRVar4 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,
             (type_info *)
             &WeakRefDictionaryEntry<Js::FunctionBody_const,Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>>
              ::typeinfo,0,(long)(int)(uint)newBuckets,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
             ,0x167);
  pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_90);
  local_68 = Memory::
             AllocateArray<Memory::Recycler,JsUtil::WeakRefDictionaryEntry<Js::FunctionBody_const,Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>>,false>
                       ((Memory *)pRVar4,(Recycler *)Memory::Recycler::Alloc,0,
                        (long)(int)(uint)newBuckets);
  Memory::
  CopyArray<JsUtil::WeakRefDictionaryEntry<Js::FunctionBody_const,Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody_const>const>,Memory::Recycler>
            (local_68,(long)(int)(uint)newBuckets,&this->entries,(long)this->count);
  if ((int)(uint)newBuckets <= this->count) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                       ,0x169,"(count < newSize)","count < newSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this->modFunctionIndex = newBuckets._4_4_;
  for (local_a4 = 0; local_a4 < this->count; local_a4 = local_a4 + 1) {
    hVar3 = PrimePolicy::GetBucket(local_68[local_a4].hash,(uint)newBuckets,this->modFunctionIndex);
    local_68[local_a4].next = local_20[hVar3];
    local_20[hVar3] = local_a4;
  }
  Memory::WriteBarrierPtr<int>::operator=(&this->buckets,local_20);
  this->size = (uint)newBuckets;
  Memory::
  WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>_>
  ::operator=(&this->entries,local_68);
  return;
}

Assistant:

void Resize()
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int newSize = PrimePolicy::GetSize(count * 2, &modIndex);

            if (newSize <= count)
            {
                // throw OOM if we can't increase the dictionary size
                Js::Throw::OutOfMemory();
            }

            int* newBuckets = RecyclerNewArrayLeaf(recycler, int, newSize);
            for (int i = 0; i < newSize; i++) newBuckets[i] = -1;
            EntryType* newEntries = RecyclerNewArray(recycler, EntryType, newSize);
            CopyArray<EntryType, Field(const RecyclerWeakReference<TKey>*)>(newEntries, newSize, entries, count);
            AnalysisAssert(count < newSize);
            modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                uint bucket = PrimePolicy::GetBucket(newEntries[i].hash, newSize, modFunctionIndex);
                newEntries[i].next = newBuckets[bucket];
                newBuckets[bucket] = i;
            }
            buckets = newBuckets;
            size = newSize;
            entries = newEntries;
        }